

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_punpk_p_aarch64(void *vd,void *vn,uint32_t pred_desc)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int length;
  ulong __n;
  uint64_t uVar3;
  uint16_t nn_2;
  uint8_t *n_1;
  uint16_t *d16;
  uint64_t nn_1;
  uint32_t *n;
  ARMPredicateReg tmp_n;
  int half;
  uint64_t nn;
  intptr_t i;
  uint64_t *d;
  intptr_t high;
  intptr_t oprsz;
  uint32_t **ppuStack_18;
  uint32_t pred_desc_local;
  void *vn_local;
  void *vd_local;
  
  uVar1 = extract32(pred_desc,0,5);
  __n = (ulong)(uVar1 + 2);
  uVar2 = extract32(pred_desc,0xc,1);
  d = (uint64_t *)(ulong)uVar2;
  if (__n < 9) {
    length = (uVar1 + 2) * 4;
    uVar3 = extract64(*vn,uVar2 * length,length);
    uVar3 = expand_bits(uVar3,0);
    *(uint64_t *)vd = uVar3;
  }
  else {
    ppuStack_18 = (uint32_t **)vn;
    if ((ulong)((long)vn - (long)vd) < __n) {
      memcpy(&n,vn,__n);
      ppuStack_18 = &n;
    }
    if (d != (uint64_t *)0x0) {
      d = (uint64_t *)((long)__n >> 1);
    }
    if (((ulong)d & 3) == 0) {
      for (nn = 0; (long)nn < (long)((__n + 7) / 8); nn = nn + 1) {
        uVar3 = expand_bits((ulong)*(uint *)((long)ppuStack_18 + (((long)d >> 2) + nn) * 4),0);
        *(uint64_t *)((long)vd + nn * 8) = uVar3;
      }
    }
    else {
      for (nn = 0; (long)nn < (long)(__n / 2); nn = nn + 1) {
        uVar3 = expand_bits((ulong)*(byte *)((long)ppuStack_18 + (long)d + nn),0);
        *(short *)((long)vd + nn * 2) = (short)uVar3;
      }
    }
  }
  return;
}

Assistant:

void HELPER(sve_punpk_p)(void *vd, void *vn, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    intptr_t high = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd;
    intptr_t i;

    if (oprsz <= 8) {
        uint64_t nn = *(uint64_t *)vn;
        int half = 4 * oprsz;

        nn = extract64(nn, high * half, half);
        nn = expand_bits(nn, 0);
        d[0] = nn;
    } else {
        ARMPredicateReg tmp_n;

        /* We produce output faster than we consume input.
           Therefore we must be mindful of possible overlap.  */
        if (((char *)vn - (char *)vd) < (uintptr_t)oprsz) {
            vn = memcpy(&tmp_n, vn, oprsz);
        }
        if (high) {
            high = oprsz >> 1;
        }

        if ((high & 3) == 0) {
            uint32_t *n = vn;
            high >>= 2;

            for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
                uint64_t nn = n[H4(high + i)];
                d[i] = expand_bits(nn, 0);
            }
        } else {
            uint16_t *d16 = vd;
            uint8_t *n = vn;

            for (i = 0; i < oprsz / 2; i++) {
                uint16_t nn = n[H1(high + i)];
                d16[H2(i)] = expand_bits(nn, 0);
            }
        }
    }
}